

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall pugi::xml_node::next_sibling(xml_node *this,char_t *name_)

{
  xml_node_struct *p;
  int iVar1;
  xml_node_struct *in_RAX;
  xml_node local_18;
  
  local_18._root = in_RAX;
  if (this->_root != (xml_node_struct *)0x0) {
    for (p = this->_root->next_sibling; p != (xml_node_struct *)0x0; p = p->next_sibling) {
      if ((p->name != (char *)0x0) && (iVar1 = strcmp(name_,p->name), iVar1 == 0)) {
        xml_node(&local_18,p);
        return (xml_node)local_18._root;
      }
    }
  }
  xml_node(&local_18);
  return (xml_node)local_18._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::next_sibling(const char_t* name_) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->next_sibling; i; i = i->next_sibling)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_node(i);
		}

		return xml_node();
	}